

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_integer_width_for_instruction(CompilerGLSL *this,Instruction *instr)

{
  bool bVar1;
  uint32_t *puVar2;
  SPIRType *pSVar3;
  SPIRType *type;
  uint32_t *ops;
  Instruction *instr_local;
  CompilerGLSL *this_local;
  
  if (instr->length < 3) {
    this_local._4_4_ = 0x20;
  }
  else {
    puVar2 = Compiler::stream(&this->super_Compiler,instr);
    if ((instr->op - 0x6f < 4) || (instr->op - 0xaa < 10)) {
      pSVar3 = Compiler::expression_type(&this->super_Compiler,puVar2[2]);
      this_local._4_4_ = pSVar3->width;
    }
    else {
      pSVar3 = Compiler::maybe_get<spirv_cross::SPIRType>(&this->super_Compiler,*puVar2);
      if ((pSVar3 == (SPIRType *)0x0) || (bVar1 = type_is_integral(pSVar3), !bVar1)) {
        this_local._4_4_ = 0x20;
      }
      else {
        this_local._4_4_ = pSVar3->width;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::get_integer_width_for_instruction(const Instruction &instr) const
{
	if (instr.length < 3)
		return 32;

	auto *ops = stream(instr);

	switch (instr.op)
	{
	case OpSConvert:
	case OpConvertSToF:
	case OpUConvert:
	case OpConvertUToF:
	case OpIEqual:
	case OpINotEqual:
	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
		return expression_type(ops[2]).width;

	default:
	{
		// We can look at result type which is more robust.
		auto *type = maybe_get<SPIRType>(ops[0]);
		if (type && type_is_integral(*type))
			return type->width;
		else
			return 32;
	}
	}
}